

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcCallContext::sendRedirectReturn
          (RpcCallContext *this)

{
  bool bVar1;
  undefined8 *puVar2;
  long *plVar3;
  uint *puVar4;
  size_t sVar5;
  Own<capnp::OutgoingRpcMessage,_std::nullptr_t> message;
  Fault f;
  DebugExpression<bool_&> _kjCondition;
  undefined8 *local_b8;
  long *local_b0;
  Array<unsigned_int> local_a8;
  StructBuilder local_90;
  StructBuilder local_68;
  SegmentBuilder *local_40;
  CapTableBuilder *pCStack_38;
  WirePointer *local_30;
  PointerBuilder local_28;
  
  local_68.segment = (SegmentBuilder *)&this->redirectResults;
  if (this->redirectResults == false) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool&>&>
              ((Fault *)&local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
               ,0xc94,FAILED,"redirectResults","_kjCondition,",(DebugExpression<bool_&> *)&local_68)
    ;
    kj::_::Debug::Fault::fatal((Fault *)&local_90);
  }
  bVar1 = (this->hints).onlyPromisePipeline;
  local_90.segment._0_1_ = bVar1 ^ 1;
  if (bVar1 == false) {
    if (this->responseSent == false) {
      this->responseSent = true;
      puVar2 = *(undefined8 **)((long)&(((this->connectionState).ptr)->connection).field_1 + 0x10);
      (**(code **)*puVar2)(&local_b8,puVar2,6);
      (**(code **)*local_b0)(&local_40);
      local_28.pointer = local_30;
      local_28.segment = local_40;
      local_28.capTable = pCStack_38;
      PointerBuilder::initStruct(&local_90,&local_28,(StructSize)0x10001);
      *(undefined2 *)local_90.data = 3;
      local_28.segment = (SegmentBuilder *)CONCAT71(local_90.segment._1_7_,(byte)local_90.segment);
      local_28.capTable = local_90.capTable;
      local_28.pointer = local_90.pointers;
      PointerBuilder::initStruct(&local_68,&local_28,(StructSize)0x10002);
      *(AnswerId *)local_68.data = this->answerId;
      *(byte *)((long)local_68.data + 4) = (byte)*(AnswerId *)((long)local_68.data + 4) | 1;
      *(undefined2 *)((long)local_68.data + 6) = 3;
      (**(code **)(*local_b0 + 0x10))();
      local_a8.ptr = (uint *)0x0;
      local_a8.size_ = 0;
      local_a8.disposer = (ArrayDisposer *)0x0;
      cleanupAnswerTable(this,&local_a8,false);
      sVar5 = local_a8.size_;
      puVar4 = local_a8.ptr;
      if (local_a8.ptr != (uint *)0x0) {
        local_a8.ptr = (uint *)0x0;
        local_a8.size_ = 0;
        (**(local_a8.disposer)->_vptr_ArrayDisposer)(local_a8.disposer,puVar4,4,sVar5,sVar5,0);
      }
      plVar3 = local_b0;
      if (local_b0 != (long *)0x0) {
        local_b0 = (long *)0x0;
        (**(code **)*local_b8)(local_b8,(long)plVar3 + *(long *)(*plVar3 + -0x10));
      }
    }
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
            ((Fault *)&local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
             ,0xc95,FAILED,"!hints.onlyPromisePipeline","_kjCondition,",
             (DebugExpression<bool> *)&local_90);
  kj::_::Debug::Fault::fatal((Fault *)&local_68);
}

Assistant:

void sendRedirectReturn() {
      KJ_ASSERT(redirectResults);
      KJ_ASSERT(!hints.onlyPromisePipeline);

      if (isFirstResponder()) {
        auto message = connectionState->connection.get<Connected>().connection
            ->newOutgoingMessage(messageSizeHint<rpc::Return>());
        auto builder = message->getBody().initAs<rpc::Message>().initReturn();

        builder.setAnswerId(answerId);
        builder.setReleaseParamCaps(false);
        builder.setResultsSentElsewhere();

        // TODO(perf): Could `noFinishNeeded` be used here? The `Finish` messages are pretty
        //   redundant after a redirect, but as this case is less common and more complicated I
        //   don't want to fully think through the implications right now.

        message->send();

        cleanupAnswerTable(nullptr, false);
      }
    }